

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

void sha1_process_message_block(sha1_context *context)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint uVar15;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [85];
  
  lVar6 = 0;
  do {
    uVar7 = (uint)context->message_block[lVar6 * 4] << 0x18;
    auStack_184[lVar6 + 3] = uVar7;
    uVar7 = (uint)context->message_block[lVar6 * 4 + 1] << 0x10 | uVar7;
    auStack_184[lVar6 + 3] = uVar7;
    uVar7 = (uint)context->message_block[lVar6 * 4 + 2] << 8 | uVar7;
    auStack_184[lVar6 + 3] = uVar7;
    auStack_184[lVar6 + 3] = context->message_block[lVar6 * 4 + 3] | uVar7;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  lVar6 = 0x10;
  do {
    uVar7 = auStack_198[lVar6] ^ auStack_184[lVar6] ^ auStack_1b8[lVar6 + 2] ^ auStack_1b8[lVar6];
    auStack_184[lVar6 + 3] = uVar7 << 1 | (uint)((int)uVar7 < 0);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x50);
  uVar1 = context->intermediate_hash[1];
  uVar2 = context->intermediate_hash[2];
  uVar3 = context->intermediate_hash[3];
  uVar4 = context->intermediate_hash[4];
  lVar6 = 0;
  uVar13 = uVar4;
  uVar5 = uVar3;
  uVar9 = uVar2;
  uVar14 = uVar1;
  uVar10 = context->intermediate_hash[0];
  do {
    uVar11 = uVar10;
    uVar7 = uVar9;
    uVar8 = uVar5;
    uVar10 = ((uVar7 ^ uVar8) & uVar14 ^ uVar8) + (uVar11 << 5 | uVar11 >> 0x1b) + uVar13 +
             auStack_184[lVar6 + 3] + 0x5a827999;
    uVar9 = uVar14 << 0x1e | uVar14 >> 2;
    lVar6 = lVar6 + 1;
    uVar13 = uVar8;
    uVar5 = uVar7;
    uVar14 = uVar11;
  } while (lVar6 != 0x14);
  lVar6 = 0x14;
  do {
    uVar15 = uVar7;
    uVar12 = uVar10;
    uVar7 = uVar9;
    uVar10 = (uVar7 ^ uVar11 ^ uVar15) + (uVar12 << 5 | uVar12 >> 0x1b) + uVar8 +
             auStack_184[lVar6 + 3] + 0x6ed9eba1;
    uVar9 = uVar11 << 0x1e | uVar11 >> 2;
    lVar6 = lVar6 + 1;
    uVar11 = uVar12;
    uVar8 = uVar15;
  } while (lVar6 != 0x28);
  lVar6 = 0x28;
  do {
    uVar8 = uVar7;
    uVar11 = uVar10;
    uVar7 = uVar9;
    uVar10 = auStack_184[lVar6 + 3] +
             (uVar8 & uVar7 | (uVar8 | uVar7) & uVar12) + (uVar11 << 5 | uVar11 >> 0x1b) + uVar15 +
             0x8f1bbcdc;
    uVar9 = uVar12 << 0x1e | uVar12 >> 2;
    lVar6 = lVar6 + 1;
    uVar12 = uVar11;
    uVar15 = uVar8;
  } while (lVar6 != 0x3c);
  lVar6 = 0x3c;
  do {
    uVar15 = uVar7;
    uVar12 = uVar10;
    uVar7 = uVar9;
    uVar10 = (uVar7 ^ uVar11 ^ uVar15) + (uVar12 << 5 | uVar12 >> 0x1b) + uVar8 +
             auStack_184[lVar6 + 3] + 0xca62c1d6;
    uVar9 = uVar11 << 0x1e | uVar11 >> 2;
    lVar6 = lVar6 + 1;
    uVar11 = uVar12;
    uVar8 = uVar15;
  } while (lVar6 != 0x50);
  context->intermediate_hash[0] = uVar10 + context->intermediate_hash[0];
  context->intermediate_hash[1] = uVar12 + uVar1;
  context->intermediate_hash[2] = uVar9 + uVar2;
  context->intermediate_hash[3] = uVar7 + uVar3;
  context->intermediate_hash[4] = uVar15 + uVar4;
  context->message_block_index = 0;
  return;
}

Assistant:

static void sha1_process_message_block(sha1_context *context)
{
	const uint32_t K[] = {/* Constants defined in SHA-1   */
	                      0x5A827999,
	                      0x6ED9EBA1,
	                      0x8F1BBCDC,
	                      0xCA62C1D6};
	int t; /* Loop counter                */
	uint32_t temp; /* Temporary word value        */
	uint32_t W[80]; /* Word sequence               */
	uint32_t A; /* Word buffers                */
	uint32_t B; /* Word buffers                */
	uint32_t C; /* Word buffers                */
	uint32_t D; /* Word buffers                */
	uint32_t E; /* Word buffers                */

	/*
	 *  Initialize the first 16 words in the array W
	 */
	for (t = 0; t < 16; t++) {
		W[t] = (uint32_t)(context->message_block[t * 4]) << 24U;
		W[t] |= (uint32_t)(context->message_block[t * 4 + 1]) << 16U;
		W[t] |= (uint32_t)(context->message_block[t * 4 + 2]) << 8U;
		W[t] |= (uint32_t)(context->message_block[t * 4 + 3]);
	}

	for (t = 16; t < 80; t++) {
		W[t] = SHA1_CIRCULAR_SHIFT(1U, W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16]);
	}

	A = context->intermediate_hash[0];
	B = context->intermediate_hash[1];
	C = context->intermediate_hash[2];
	D = context->intermediate_hash[3];
	E = context->intermediate_hash[4];

	for (t = 0; t < 20; t++) {
		temp = SHA1_CIRCULAR_SHIFT(5U, A) +
		       ((B & C) | ((~B) & D)) + E + W[t] + K[0];
		E = D;
		D = C;
		C = SHA1_CIRCULAR_SHIFT(30U, B);

		B = A;
		A = temp;
	}

	for (t = 20; t < 40; t++) {
		temp = SHA1_CIRCULAR_SHIFT(5U, A) + (B ^ C ^ D) + E + W[t] + K[1];
		E = D;
		D = C;
		C = SHA1_CIRCULAR_SHIFT(30U, B);
		B = A;
		A = temp;
	}

	for (t = 40; t < 60; t++) {
		temp = SHA1_CIRCULAR_SHIFT(5U, A) +
		       ((B & C) | (B & D) | (C & D)) + E + W[t] + K[2];
		E = D;
		D = C;
		C = SHA1_CIRCULAR_SHIFT(30U, B);
		B = A;
		A = temp;
	}

	for (t = 60; t < 80; t++) {
		temp = SHA1_CIRCULAR_SHIFT(5U, A) + (B ^ C ^ D) + E + W[t] + K[3];
		E = D;
		D = C;
		C = SHA1_CIRCULAR_SHIFT(30U, B);
		B = A;
		A = temp;
	}

	context->intermediate_hash[0] += A;
	context->intermediate_hash[1] += B;
	context->intermediate_hash[2] += C;
	context->intermediate_hash[3] += D;
	context->intermediate_hash[4] += E;

	context->message_block_index = 0;
}